

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

charcount_t __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::LineLength
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr first,EncodedCharPtr last,
          size_t *cb)

{
  byte *pbVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  char16 cVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  charcount_t cVar8;
  byte *local_38;
  
  if (cb == (size_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,199,"(cb != nullptr)","cb != nullptr");
    if (!bVar4) goto LAB_00f01cf1;
    *puVar6 = 0;
  }
  cVar8 = 0;
  pbVar7 = first;
  if (first < last) {
    cVar8 = 0;
    local_38 = first + 1;
    do {
      bVar2 = *pbVar7;
      cVar5 = (char16)bVar2;
      if ((char)bVar2 < '\0') {
        cVar5 = utf8::DecodeTail((ushort)bVar2,&local_38,last,
                                 &(this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions,
                                 (bool *)0x0);
      }
      if ((((ushort)cVar5 < 0xe) && ((0x2401U >> ((ushort)cVar5 & 0x1f) & 1) != 0)) ||
         ((ushort)cVar5 - 0x2028 < 2)) break;
      cVar8 = cVar8 + 1;
      pbVar1 = local_38 + 1;
      bVar4 = local_38 < last;
      pbVar7 = local_38;
      local_38 = pbVar1;
    } while (bVar4);
    if (pbVar7 < first) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0xdb,"(prev >= first)","prev >= first");
      if (!bVar4) {
LAB_00f01cf1:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
  *cb = (long)pbVar7 - (long)first;
  return cVar8;
}

Assistant:

charcount_t Scanner<EncodingPolicy>::LineLength(EncodedCharPtr first, EncodedCharPtr last, size_t* cb)
{
    Assert(cb != nullptr);

    charcount_t result = 0;
    EncodedCharPtr p = first;

    for (;;)
    {
        EncodedCharPtr prev = p;
        switch( this->template ReadFull<false>(p, last) )
        {
            case kchNWL: // _C_NWL
            case kchRET:
            case kchLS:
            case kchPS:
            case kchNUL: // _C_NUL
                // p is now advanced past the line terminator character.
                // We need to know the number of bytes making up the line, not including the line terminator character.
                // To avoid subtracting a variable number of bytes because the line terminator characters are different
                // number of bytes long (plus there may be multiple valid encodings for these characters) just keep
                // track of the first byte of the line terminator character in prev.
                Assert(prev >= first);
                *cb = prev - first;
                return result;
        }
        result++;
    }
}